

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

Error __thiscall miniros::MasterLink::initParam(MasterLink *this,M_string *remappings)

{
  char *pcVar1;
  RPCManager *this_00;
  int i;
  _Base_ptr p_Var2;
  socklen_t __len;
  undefined8 in_RCX;
  allocator<char> local_71;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  string local_name;
  
  for (p_Var2 = (remappings->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      __len = (socklen_t)in_RCX,
      (_Rb_tree_header *)p_Var2 != &(remappings->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    if ((_Base_ptr)0x1 < p_Var2[1]._M_parent) {
      pcVar1 = *(char **)(p_Var2 + 1);
      if ((*pcVar1 == '_') && (pcVar1[1] != '_')) {
        in_RCX = 0xffffffffffffffff;
        std::__cxx11::string::substr((ulong)&local_70,(ulong)(p_Var2 + 1));
        std::operator+(&local_name,"~",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70);
        std::__cxx11::string::~string((string *)local_70._M_pod_data);
        i = std::__cxx11::stoi((string *)(p_Var2 + 2),(size_t *)0x0,10);
        names::resolve((string *)&local_70,&local_name,true);
        set(this,(string *)&local_70,i);
        std::__cxx11::string::~string((string *)local_70._M_pod_data);
        std::__cxx11::string::~string((string *)&local_name);
      }
    }
  }
  this_00 = (this->internal_->rpcManager).
            super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (RPCManager *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_name,"paramUpdate",&local_71);
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp:1043:7)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp:1043:7)>
               ::_M_manager;
    local_70._M_unused._M_object = this;
    RPCManager::bind(this_00,(int)&local_name,(sockaddr *)&local_70,__len);
    std::_Function_base::~_Function_base((_Function_base *)&local_70);
    std::__cxx11::string::~string((string *)&local_name);
  }
  return (Error)Ok;
}

Assistant:

Error MasterLink::initParam(const M_string& remappings)
{
  auto it = remappings.begin();
  auto end = remappings.end();
  for (; it != end; ++it) {
    const std::string& name = it->first;
    const std::string& param = it->second;

    if (name.size() < 2) {
      continue;
    }

    if (name[0] == '_' && name[1] != '_') {
      std::string local_name = "~" + name.substr(1);

      bool success = false;

      try {
        auto i = std::stoi(param);
        this->set(names::resolve(local_name), i);
        success = true;
      } catch (std::invalid_argument&) {
      } catch (std::out_of_range&) {
      }

      if (success) {
        continue;
      }

      try {
        double d = std::stod(param);
        this->set(names::resolve(local_name), d);
        success = true;
      } catch (std::invalid_argument&) {
      } catch (std::out_of_range&) {
      }

      if (success) {
        continue;
      }

      if (param == "true" || param == "True" || param == "TRUE") {
        this->set(names::resolve(local_name), true);
      } else if (param == "false" || param == "False" || param == "FALSE") {
        this->set(names::resolve(local_name), false);
      } else {
        this->set(names::resolve(local_name), param);
      }
    }
  }

  if (internal_->rpcManager) {
    internal_->rpcManager->bind("paramUpdate",
      [this](const RpcValue& params, RpcValue& result) {
        return paramUpdateCallback(params, result);
      });
  }
  return Error::Ok;
}